

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_7::Validator::OnBrTableExpr(Validator *this,BrTableExpr *expr)

{
  pointer pVVar1;
  char *pcVar2;
  int extraout_EDX;
  int __c;
  int extraout_EDX_00;
  TypeChecker *this_00;
  BrTableExpr *__s;
  Var *var;
  pointer this_01;
  
  this->expr_loc_ = &(expr->super_ExprMixin<(wabt::ExprType)10>).super_Expr.loc;
  this_00 = &this->typechecker_;
  __s = expr;
  TypeChecker::BeginBrTable(this_00);
  pVVar1 = (expr->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __c = extraout_EDX;
  for (this_01 = (expr->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
                 super__Vector_impl_data._M_start; this_01 != pVVar1; this_01 = this_01 + 1) {
    pcVar2 = Var::index(this_01,(char *)__s,__c);
    __s = (BrTableExpr *)((ulong)pcVar2 & 0xffffffff);
    TypeChecker::OnBrTableTarget(this_00,(Index)pcVar2);
    __c = extraout_EDX_00;
  }
  pcVar2 = Var::index(&expr->default_target,(char *)__s,__c);
  TypeChecker::OnBrTableTarget(this_00,(Index)pcVar2);
  TypeChecker::EndBrTable(this_00);
  return (Result)Ok;
}

Assistant:

Result Validator::OnBrTableExpr(BrTableExpr* expr) {
  expr_loc_ = &expr->loc;
  typechecker_.BeginBrTable();
  for (const Var& var : expr->targets) {
    typechecker_.OnBrTableTarget(var.index());
  }
  typechecker_.OnBrTableTarget(expr->default_target.index());
  typechecker_.EndBrTable();
  return Result::Ok;
}